

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j)

{
  void *__ptr;
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  
  *psi = 1.0;
  __ptr = malloc((long)q * 8 + 8);
  if (0 < q) {
    memcpy((void *)((long)__ptr + 8),theta,(ulong)(uint)q << 3);
  }
  if (1 < j) {
    uVar1 = 1;
    lVar2 = 0;
    do {
      psi[uVar1] = 0.0;
      dVar5 = 0.0;
      dVar6 = 0.0;
      if ((long)uVar1 <= (long)q) {
        dVar6 = *(double *)((long)__ptr + uVar1 * 8);
        psi[uVar1] = dVar6;
      }
      if (0 < p) {
        lVar3 = 0;
        lVar4 = lVar2;
        do {
          if (-1 < lVar4) {
            dVar5 = dVar5 + phi[lVar3] * psi[lVar4];
          }
          lVar4 = lVar4 + -1;
          lVar3 = lVar3 + 1;
        } while ((ulong)(p + 1) - 1 != lVar3);
      }
      psi[uVar1] = dVar5 + dVar6;
      uVar1 = uVar1 + 1;
      lVar2 = lVar2 + 1;
    } while (uVar1 != (uint)j);
  }
  free(__ptr);
  return;
}

Assistant:

void psiweight(double *phi,double *theta,double *psi,int p,int q,int j) {
	int i,k;
	double temp;
	double *th;
	psi[0] = 1.0;
	th = (double*) malloc(sizeof(double) * (q+1));	
	th[0] = 1.;
	for(i = 0; i < q;++i) {
		th[i+1] = theta[i];
	}
	
	for(i = 1; i < j;++i) {
		psi[i] = 0.0;
		temp = 0.0;
		if(i <= q) {
			psi[i] = th[i];
		}
		for(k = 1; k < p+1;++k) {
			if((i - k) >= 0) {
				temp+=phi[k-1] * psi[i-k];
			} 
			
		}
		psi[i] += temp;
	}
	
	free(th);
}